

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall cxxopts::Options::Options(Options *this,string *program,string *help_string)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  undefined8 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  
  paVar6 = &(this->m_program).field_2;
  (this->m_program)._M_dataplus._M_p = (pointer)paVar6;
  pcVar3 = (program->_M_dataplus)._M_p;
  paVar1 = &program->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&program->field_2 + 8);
    paVar6->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_program).field_2 + 8) = uVar4;
  }
  else {
    (this->m_program)._M_dataplus._M_p = pcVar3;
    (this->m_program).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->m_program)._M_string_length = program->_M_string_length;
  (program->_M_dataplus)._M_p = (pointer)paVar1;
  program->_M_string_length = 0;
  (program->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->m_help_string).field_2;
  (this->m_help_string)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (help_string->_M_dataplus)._M_p;
  paVar6 = &help_string->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar6) {
    uVar4 = *(undefined8 *)((long)&help_string->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar6->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_help_string).field_2 + 8) = uVar4;
  }
  else {
    (this->m_help_string)._M_dataplus._M_p = pcVar3;
    (this->m_help_string).field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  (this->m_help_string)._M_string_length = help_string->_M_string_length;
  (help_string->_M_dataplus)._M_p = (pointer)paVar6;
  help_string->_M_string_length = 0;
  (help_string->field_2)._M_local_buf[0] = '\0';
  (this->m_custom_help)._M_dataplus._M_p = (pointer)&(this->m_custom_help).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_custom_help,"[OPTION...]","");
  (this->m_positional_help)._M_dataplus._M_p = (pointer)&(this->m_positional_help).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->m_positional_help,"positional parameters","");
  this->m_show_positional = false;
  this->m_allow_unrecognised = false;
  (this->m_options).
  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0013f000;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[1]._M_use_count = 0;
  p_Var5[1]._M_weak_count = 0;
  p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[3]._M_use_count = 0;
  p_Var5[3]._M_weak_count = 0;
  p_Var5[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)(p_Var5 + 4);
  p_Var5[1]._M_use_count = 1;
  p_Var5[1]._M_weak_count = 0;
  p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[2]._M_use_count = 0;
  p_Var5[2]._M_weak_count = 0;
  *(undefined4 *)&p_Var5[3]._vptr__Sp_counted_base = 0x3f800000;
  p_Var5[3]._M_use_count = 0;
  p_Var5[3]._M_weak_count = 0;
  p_Var5[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  (this->m_options).
  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var5;
  (this->m_options).
  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(p_Var5 + 1);
  (this->m_positional).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_positional).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_positional).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_next_positional)._M_current =
       (this->m_positional).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_positional_set)._M_h._M_buckets = &(this->m_positional_set)._M_h._M_single_bucket;
  (this->m_positional_set)._M_h._M_bucket_count = 1;
  (this->m_positional_set)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_positional_set)._M_h._M_element_count = 0;
  (this->m_positional_set)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_positional_set)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_positional_set)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var2 = &(this->m_help)._M_t._M_impl.super__Rb_tree_header;
  (this->m_help)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_help)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_help)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_help)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_help)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Options(std::string program, std::string help_string = "")
    : m_program(std::move(program))
    , m_help_string(toLocalString(std::move(help_string)))
    , m_custom_help("[OPTION...]")
    , m_positional_help("positional parameters")
    , m_show_positional(false)
    , m_allow_unrecognised(false)
    , m_options(std::make_shared<OptionMap>())
    , m_next_positional(m_positional.end())
    {
    }